

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

char * jsonp_strndup(char *str,size_t len)

{
  char *new_str;
  size_t len_local;
  char *str_local;
  
  str_local = (char *)jsonp_malloc(len + 1);
  if (str_local == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    memcpy(str_local,str,len);
    str_local[len] = '\0';
  }
  return str_local;
}

Assistant:

char *jsonp_strndup(const char *str, size_t len)
{
    char *new_str;

    new_str = jsonp_malloc(len + 1);
    if(!new_str)
        return NULL;

    memcpy(new_str, str, len);
    new_str[len] = '\0';
    return new_str;
}